

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O2

int mixed_queue_remove(mixed_segment *old,mixed_segment *segment)

{
  vector *vector;
  int iVar1;
  int iVar2;
  uint32_t i;
  uint uVar3;
  mixed_segment_info info;
  
  vector = (vector *)segment->data;
  iVar2 = 0;
  memset(&info,0,0x420);
  mixed_segment_end(old);
  iVar1 = vector_remove_item(old,vector);
  if (iVar1 != 0) {
    mixed_segment_info(&info,old);
    for (uVar3 = 0; uVar3 < info.max_inputs; uVar3 = uVar3 + 1) {
      mixed_segment_set_in(0,uVar3,(void *)0x0,old);
    }
    iVar2 = 1;
    for (uVar3 = 0; uVar3 < info.outputs; uVar3 = uVar3 + 1) {
      mixed_segment_set_out(0,uVar3,(void *)0x0,old);
    }
  }
  return iVar2;
}

Assistant:

MIXED_EXPORT int mixed_queue_remove(struct mixed_segment *old, struct mixed_segment *segment){
  struct queue_segment_data *data = (struct queue_segment_data *)segment->data;
  struct mixed_segment_info info = {0};

  mixed_segment_end(old);
  // If the stop fails we remove it anyway.
  
  if(!vector_remove_item(old, (struct vector *)data))
    return 0;
    
  mixed_segment_info(&info, old);
  for(uint32_t i=0; i<info.max_inputs; ++i){
    mixed_segment_set_in(MIXED_BUFFER, i, 0, old);
  }
  for(uint32_t i=0; i<info.outputs; ++i){
    mixed_segment_set_out(MIXED_BUFFER, i, 0, old);
  }
  return 1;
}